

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void releaseMemArray(Mem *p,int N)

{
  void *p_00;
  int in_ESI;
  void *in_RDI;
  sqlite3 *db;
  Mem *pEnd;
  void *in_stack_ffffffffffffffd8;
  sqlite3 *db_00;
  undefined4 in_stack_fffffffffffffff0;
  void *local_8;
  
  if ((in_RDI != (void *)0x0) && (in_ESI != 0)) {
    p_00 = (void *)((long)in_RDI + (long)in_ESI * 0x38);
    db_00 = *(sqlite3 **)((long)in_RDI + 0x18);
    local_8 = in_RDI;
    if (db_00->pnBytesFreed == (int *)0x0) {
      do {
        if ((*(ushort *)((long)local_8 + 0x14) & 0x9000) == 0) {
          if (*(int *)((long)local_8 + 0x20) != 0) {
            sqlite3DbNNFreeNN((sqlite3 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),p_00);
            *(undefined4 *)((long)local_8 + 0x20) = 0;
            *(undefined2 *)((long)local_8 + 0x14) = 0;
          }
        }
        else {
          sqlite3VdbeMemRelease((Mem *)0x16f85f);
          *(undefined2 *)((long)local_8 + 0x14) = 0;
        }
        local_8 = (void *)((long)local_8 + 0x38);
      } while (local_8 < p_00);
    }
    else {
      do {
        if (*(int *)((long)local_8 + 0x20) != 0) {
          sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
        }
        local_8 = (void *)((long)local_8 + 0x38);
      } while (local_8 < p_00);
    }
  }
  return;
}

Assistant:

static void releaseMemArray(Mem *p, int N){
  if( p && N ){
    Mem *pEnd = &p[N];
    sqlite3 *db = p->db;
    assert( db!=0 );
    if( db->pnBytesFreed ){
      do{
        if( p->szMalloc ) sqlite3DbFree(db, p->zMalloc);
      }while( (++p)<pEnd );
      return;
    }
    do{
      assert( (&p[1])==pEnd || p[0].db==p[1].db );
      assert( sqlite3VdbeCheckMemInvariants(p) );

      /* This block is really an inlined version of sqlite3VdbeMemRelease()
      ** that takes advantage of the fact that the memory cell value is
      ** being set to NULL after releasing any dynamic resources.
      **
      ** The justification for duplicating code is that according to
      ** callgrind, this causes a certain test case to hit the CPU 4.7
      ** percent less (x86 linux, gcc version 4.1.2, -O6) than if
      ** sqlite3MemRelease() were called from here. With -O2, this jumps
      ** to 6.6 percent. The test case is inserting 1000 rows into a table
      ** with no indexes using a single prepared INSERT statement, bind()
      ** and reset(). Inserts are grouped into a transaction.
      */
      testcase( p->flags & MEM_Agg );
      testcase( p->flags & MEM_Dyn );
      if( p->flags&(MEM_Agg|MEM_Dyn) ){
        testcase( (p->flags & MEM_Dyn)!=0 && p->xDel==sqlite3VdbeFrameMemDel );
        sqlite3VdbeMemRelease(p);
        p->flags = MEM_Undefined;
      }else if( p->szMalloc ){
        sqlite3DbNNFreeNN(db, p->zMalloc);
        p->szMalloc = 0;
        p->flags = MEM_Undefined;
      }
#ifdef SQLITE_DEBUG
      else{
        p->flags = MEM_Undefined;
      }
#endif
    }while( (++p)<pEnd );
  }
}